

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TryOptConstFoldBrEqual
          (GlobOpt *this,Instr *instr,bool branchOnEqual,Value *src1Value,int32 min1,int32 max1,
          Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *pVVar4;
  int32 max1_local;
  int32 min1_local;
  Value *src1Value_local;
  bool branchOnEqual_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27fa,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27fb,"(src1Value)","src1Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoAggressiveIntTypeSpec(this);
  if (bVar2) {
    pVVar4 = ::Value::GetValueInfo(src1Value);
    bVar2 = ValueType::IsLikelyInt(&pVVar4->super_ValueType);
  }
  else {
    pVVar4 = ::Value::GetValueInfo(src1Value);
    bVar2 = ValueType::IsInt(&pVVar4->super_ValueType);
  }
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27fc,
                       "(DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt())"
                       ,
                       "DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (src2Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27fd,"(src2Value)","src2Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoAggressiveIntTypeSpec(this);
  if (bVar2) {
    pVVar4 = ::Value::GetValueInfo(src2Value);
    bVar2 = ValueType::IsLikelyInt(&pVVar4->super_ValueType);
    if (bVar2) goto LAB_005a72cf;
  }
  else {
    pVVar4 = ::Value::GetValueInfo(src2Value);
    bVar2 = ValueType::IsInt(&pVVar4->super_ValueType);
    if (bVar2) goto LAB_005a72cf;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x27fe,
                     "(DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt())"
                     ,
                     "DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt()"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_005a72cf:
  bVar2 = ValueInfo::IsEqualTo(src1Value,min1,max1,src2Value,min2,max2);
  if (bVar2) {
    OptConstFoldBr(this,branchOnEqual,instr,src1Value,src2Value);
    this_local._7_1_ = true;
  }
  else {
    bVar2 = ValueInfo::IsNotEqualTo(src1Value,min1,max1,src2Value,min2,max2);
    if (bVar2) {
      OptConstFoldBr(this,(bool)((branchOnEqual ^ 0xffU) & 1),instr,src1Value,src2Value);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrEqual(
    IR::Instr *const instr,
    const bool branchOnEqual,
    Value *const src1Value,
    const int32 min1,
    const int32 max1,
    Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    Assert(instr);
    Assert(src1Value);
    Assert(DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt());
    Assert(src2Value);
    Assert(DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt());

    if(ValueInfo::IsEqualTo(src1Value, min1, max1, src2Value, min2, max2))
    {
        OptConstFoldBr(branchOnEqual, instr, src1Value, src2Value);
        return true;
    }
    if(ValueInfo::IsNotEqualTo(src1Value, min1, max1, src2Value, min2, max2))
    {
        OptConstFoldBr(!branchOnEqual, instr, src1Value, src2Value);
        return true;
    }
    return false;
}